

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

void __thiscall RTVector3::accelToQuaternion(RTVector3 *this,RTQuaternion *qPose)

{
  RTVector3 normAccel;
  RTVector3 z;
  float local_6c;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  RTVector3 local_48;
  RTVector3 local_38;
  RTVector3 local_2c;
  
  local_38.m_data[2] = this->m_data[2];
  local_38.m_data[0] = (RTFLOAT)*(undefined8 *)this->m_data;
  local_38.m_data[1] = (RTFLOAT)((ulong)*(undefined8 *)this->m_data >> 0x20);
  RTVector3(&local_48);
  RTVector3(&local_2c,0.0,0.0,1.0);
  normalize(&local_38);
  local_58 = ZEXT416((uint)local_38.m_data[0]);
  local_68 = local_38.m_data[1];
  fStack_64 = local_38.m_data[2];
  uStack_60 = 0;
  local_6c = acosf(local_38.m_data[2] * local_2c.m_data[2] +
                   local_2c.m_data[0] * local_38.m_data[0] + local_2c.m_data[1] * local_38.m_data[1]
                  );
  local_48.m_data[1] = local_2c.m_data[0] * fStack_64 - (float)local_58._0_4_ * local_2c.m_data[2];
  local_48.m_data[0] = local_2c.m_data[2] * local_68 - fStack_64 * local_2c.m_data[1];
  local_48.m_data[2] = (float)local_58._0_4_ * local_2c.m_data[1] - local_2c.m_data[0] * local_68;
  normalize(&local_48);
  RTQuaternion::fromAngleVector(qPose,&local_6c,&local_48);
  return;
}

Assistant:

void RTVector3::accelToQuaternion(RTQuaternion& qPose) const
{
    RTVector3 normAccel = *this;
    RTVector3 vec;
    RTVector3 z(0, 0, 1.0);

    normAccel.normalize();

    RTFLOAT angle = acos(RTVector3::dotProduct(z, normAccel));
    RTVector3::crossProduct(normAccel, z, vec);
    vec.normalize();

    qPose.fromAngleVector(angle, vec);
}